

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

InterfaceHandle __thiscall
helics::CommonCore::registerEndpoint
          (CommonCore *this,LocalFederateId federateID,string_view name,string_view type)

{
  InterfaceHandle handle;
  string_view units;
  undefined1 auVar1 [16];
  FederateState *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  ActionMessage reg;
  
  this_00 = checkNewInterface(this,federateID,name,ENDPOINT);
  reg._0_8_ = &reg.dest_id;
  reg.source_id.gid = 0;
  reg.source_handle.hid = 0;
  reg.dest_id.gid._0_1_ = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = reg._0_8_;
  ppVar2 = createBasicHandle(this,(GlobalFederateId)(this_00->global_id)._M_i.gid,
                             (LocalFederateId)(this_00->local_id).fid,ENDPOINT,name,type,
                             (string_view)(auVar1 << 0x40),
                             (this_00->interfaceFlags).super___atomic_base<unsigned_short>._M_i);
  std::__cxx11::string::~string((string *)&reg);
  handle.hid = *(BaseType *)((long)&(ppVar2->first)._M_dataplus._M_p + 4);
  units._M_str = gEmptyString_abi_cxx11_;
  units._M_len = DAT_00508e78;
  FederateState::createInterface
            (this_00,ENDPOINT,handle,name,type,units,
             (this_00->interfaceFlags).super___atomic_base<unsigned_short>._M_i);
  ActionMessage::ActionMessage(&reg,cmd_reg_end);
  reg.source_handle.hid = handle.hid;
  reg.source_id.gid = (this_00->global_id)._M_i.gid;
  ActionMessage::name(&reg,name);
  ActionMessage::setStringData(&reg,type);
  reg.flags = *(uint16_t *)((long)&(ppVar2->first)._M_string_length + 6);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(&(this->super_BrokerBase).actionQueue,&reg);
  ActionMessage::~ActionMessage(&reg);
  return (InterfaceHandle)handle.hid;
}

Assistant:

InterfaceHandle CommonCore::registerEndpoint(LocalFederateId federateID,
                                             std::string_view name,
                                             std::string_view type)
{
    auto* fed = checkNewInterface(federateID, name, InterfaceType::ENDPOINT);
    const auto& handle = createBasicHandle(fed->global_id,
                                           fed->local_id,
                                           InterfaceType::ENDPOINT,
                                           name,
                                           type,
                                           std::string{},
                                           fed->getInterfaceFlags());

    auto hid = handle.getInterfaceHandle();
    fed->createInterface(
        InterfaceType::ENDPOINT, hid, name, type, gEmptyString, fed->getInterfaceFlags());
    ActionMessage reg(CMD_REG_ENDPOINT);
    reg.source_id = fed->global_id.load();
    reg.source_handle = hid;
    reg.name(name);
    reg.setStringData(type);
    reg.flags = handle.flags;
    actionQueue.push(std::move(reg));

    return hid;
}